

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O1

int stbi__pnm_test(stbi__context *s)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  int iVar3;
  
  sVar1 = stbi__get8(s);
  sVar2 = stbi__get8(s);
  if ((sVar1 != 'P') || (iVar3 = 1, (byte)(sVar2 - 0x37) < 0xfe)) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int      stbi__pnm_test(stbi__context *s)
{
   char p, t;
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind( s );
       return 0;
   }
   return 1;
}